

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  short sVar2;
  undefined8 uVar3;
  short sVar4;
  byte bVar5;
  byte bVar6;
  _func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *p_Var7;
  byte bVar8;
  byte bVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  int iVar23;
  stbi__uint32 sVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  uchar *puVar31;
  float *__ptr;
  void *pvVar32;
  code *pcVar33;
  uchar *puVar34;
  undefined8 *puVar35;
  stbi_uc *psVar36;
  undefined8 extraout_RAX;
  stbi__context *psVar37;
  stbi__huffman *h;
  undefined8 *puVar38;
  ulong uVar39;
  short sVar40;
  uint uVar41;
  undefined1 *puVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  bool bVar50;
  int *piVar51;
  int iVar52;
  uint uVar53;
  short *data_00;
  undefined1 auVar54 [8];
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  stbi_uc **ppsVar58;
  int id;
  uint uVar59;
  stbi__uint32 z;
  uint n;
  float *pfVar60;
  byte *pbVar61;
  stbi__context *psVar62;
  uchar *puVar63;
  bool bVar64;
  float fVar65;
  float fVar66;
  undefined1 local_4a18 [8];
  stbi__jpeg j;
  short local_1b8 [4];
  short data [64];
  stbi_uc *local_f8;
  stbi_uc *coutput [4];
  int local_d0;
  int local_cc;
  int local_c8;
  uint local_ac;
  int local_88;
  uint local_60;
  stbi_uc *local_50;
  uchar *local_40;
  
  uVar43 = (ulong)(uint)req_comp;
  j._18272_8_ = stbi__idct_block;
  j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
  j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
  local_4a18 = (undefined1  [8])s;
  iVar16 = stbi__decode_jpeg_header((stbi__jpeg *)local_4a18,1);
  s->img_buffer = s->img_buffer_original;
  if (iVar16 != 0) {
    j._18272_8_ = stbi__idct_block;
    j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
    j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar30 = 0x45d8; lVar30 != 0x4758; lVar30 = lVar30 + 0x60) {
        psVar36 = j.huff_dc[0].fast + lVar30 + -0x10;
        psVar36[0] = '\0';
        psVar36[1] = '\0';
        psVar36[2] = '\0';
        psVar36[3] = '\0';
        psVar36[4] = '\0';
        psVar36[5] = '\0';
        psVar36[6] = '\0';
        psVar36[7] = '\0';
        psVar36 = j.huff_dc[0].fast + lVar30 + -8;
        psVar36[0] = '\0';
        psVar36[1] = '\0';
        psVar36[2] = '\0';
        psVar36[3] = '\0';
        psVar36[4] = '\0';
        psVar36[5] = '\0';
        psVar36[6] = '\0';
        psVar36[7] = '\0';
      }
      j.order[2] = 0;
      local_4a18 = (undefined1  [8])s;
      iVar16 = stbi__decode_jpeg_header((stbi__jpeg *)local_4a18,0);
      if (iVar16 == 0) {
LAB_00120828:
        stbi__cleanup_jpeg((stbi__jpeg *)local_4a18);
        return (uchar *)0x0;
      }
      bVar8 = stbi__get_marker((stbi__jpeg *)local_4a18);
LAB_0011eb7c:
      if (bVar8 == 0xda) {
        iVar16 = stbi__get16be((stbi__context *)local_4a18);
        bVar8 = stbi__get8((stbi__context *)local_4a18);
        j.succ_low = (int)bVar8;
        if (((byte)(bVar8 - 5) < 0xfc) || (*(int *)((long)local_4a18 + 8) < (int)(uint)bVar8)) {
          stbi__g_failure_reason = "bad SOS component count";
        }
        else {
          if (iVar16 == (uint)bVar8 * 2 + 6) {
            lVar30 = 0;
            while( true ) {
              piVar51 = &j.img_mcu_w;
              lVar49 = (long)j.succ_low;
              bVar8 = stbi__get8((stbi__context *)local_4a18);
              if (lVar49 <= lVar30) break;
              bVar9 = stbi__get8((stbi__context *)local_4a18);
              uVar59 = *(int *)((long)local_4a18 + 8);
              uVar57 = 0;
              if (0 < (int)uVar59) {
                uVar57 = (ulong)uVar59;
              }
              for (uVar47 = 0; uVar57 != uVar47; uVar47 = uVar47 + 1) {
                if (*piVar51 == (uint)bVar8) {
                  uVar57 = uVar47 & 0xffffffff;
                  break;
                }
                piVar51 = piVar51 + 0x18;
              }
              if ((uint)uVar57 == uVar59) goto LAB_00120828;
              j.img_comp[uVar57].v = (uint)(bVar9 >> 4);
              if (0x3f < bVar9) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00120828;
              }
              j.img_comp[uVar57].tq = bVar9 & 0xf;
              if (3 < (bVar9 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00120828;
              }
              j.order[lVar30 + -2] = (uint)uVar57;
              lVar30 = lVar30 + 1;
            }
            j.nomore = (uint)bVar8;
            bVar8 = stbi__get8((stbi__context *)local_4a18);
            j.progressive = (int)bVar8;
            bVar8 = stbi__get8((stbi__context *)local_4a18);
            iVar16 = j.eob_run;
            j.spec_start = (uint)(bVar8 >> 4);
            j.spec_end = bVar8 & 0xf;
            if (j._18216_4_ == 0) {
              if ((j.nomore != 0) || ((0xf < bVar8 || ((bVar8 & 0xf) != 0)))) {
LAB_00120453:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_00120828;
              }
              j.progressive = 0x3f;
            }
            else if ((((0x3f < j.nomore) || (0x3f < j.progressive)) || (j.progressive < j.nomore))
                    || ((0xdf < bVar8 || (0xd < (bVar8 & 0xf))))) goto LAB_00120453;
            j.img_comp[3].coeff_w = 0;
            j.img_comp[3].coeff_h = 0;
            j.code_bits = 0;
            j.img_comp[2].hd = 0;
            j.img_comp[1].hd = 0;
            j.img_comp[0].hd = 0;
            j.order[3] = j.order[2];
            if (j.order[2] == 0) {
              j.order[3] = 0x7fffffff;
            }
            j.succ_high = 0;
            j.code_buffer._0_1_ = 0xff;
            if (j._18216_4_ == 0) {
              if (j.succ_low == 1) {
                lVar30 = (long)j.eob_run;
                uVar59 = j.img_comp[lVar30].ha + 7 >> 3;
                iVar52 = j.img_comp[lVar30].dc_pred + 7 >> 3;
                iVar23 = 0;
                if ((int)uVar59 < 1) {
                  uVar59 = 0;
                }
                if (iVar52 < 1) {
                  iVar52 = 0;
                }
                for (iVar44 = 0; iVar44 != iVar52; iVar44 = iVar44 + 1) {
                  for (lVar49 = 0; (ulong)uVar59 * 8 != lVar49; lVar49 = lVar49 + 8) {
                    lVar48 = (long)j.img_comp[lVar30].tq;
                    iVar45 = stbi__jpeg_decode_block
                                       ((stbi__jpeg *)local_4a18,local_1b8,
                                        (stbi__huffman *)
                                        (j.huff_dc[(long)j.img_comp[lVar30].v + -1].delta + 0xf),
                                        (stbi__huffman *)(j.huff_ac[lVar48 + -1].delta + 0xf),
                                        j.fast_ac[lVar48 + -1] + 0x1fc,iVar16,
                                        j.dequant[(long)j.img_comp[lVar30].h + -1] + 0x38);
                    if (iVar45 == 0) goto LAB_0011f6be;
                    iVar45 = j.img_comp[lVar30].x;
                    (*(code *)j._18272_8_)
                              ((long)(iVar23 * iVar45) + *(long *)&j.img_comp[lVar30].h2 + lVar49,
                               iVar45,local_1b8);
                    iVar45 = j.order[3];
                    j.order[3] = j.order[3] + -1;
                    if (iVar45 < 2) {
                      if (j.img_comp[3].coeff_h < 0x18) {
                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a18);
                      }
                      if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011f71f;
                      j.img_comp[3].coeff_w = 0;
                      j.img_comp[3].coeff_h = 0;
                      j.code_bits = 0;
                      j.img_comp[2].hd = 0;
                      j.img_comp[1].hd = 0;
                      j.img_comp[0].hd = 0;
                      j.code_buffer._0_1_ = 0xff;
                      j.order[3] = j.order[2];
                      if (j.order[2] == 0) {
                        j.order[3] = 0x7fffffff;
                      }
                      j.succ_high = 0;
                    }
                  }
                  iVar23 = iVar23 + 8;
                }
              }
              else {
                for (iVar16 = 0; iVar16 < j.img_v_max; iVar16 = iVar16 + 1) {
                  for (iVar52 = 0; iVar52 < j.img_h_max; iVar52 = iVar52 + 1) {
                    for (lVar30 = 0; iVar23 = j.order[3], lVar30 < j.succ_low; lVar30 = lVar30 + 1)
                    {
                      iVar23 = j.order[lVar30 + -2];
                      for (iVar44 = 0; iVar44 < j.img_comp[iVar23].id; iVar44 = iVar44 + 1) {
                        for (iVar45 = 0; iVar17 = j.img_comp[(long)iVar23 + -1].coeff_h,
                            iVar45 < iVar17; iVar45 = iVar45 + 1) {
                          iVar18 = j.img_comp[iVar23].id;
                          lVar49 = (long)j.img_comp[iVar23].tq;
                          iVar19 = stbi__jpeg_decode_block
                                             ((stbi__jpeg *)local_4a18,local_1b8,
                                              (stbi__huffman *)
                                              (j.huff_dc[(long)j.img_comp[iVar23].v + -1].delta +
                                              0xf),(stbi__huffman *)
                                                   (j.huff_ac[lVar49 + -1].delta + 0xf),
                                              j.fast_ac[lVar49 + -1] + 0x1fc,iVar23,
                                              j.dequant[(long)j.img_comp[iVar23].h + -1] + 0x38);
                          if (iVar19 == 0) goto LAB_0011f6be;
                          iVar19 = j.img_comp[iVar23].x;
                          (*(code *)j._18272_8_)
                                    ((long)((iVar17 * iVar52 + iVar45) * 8) +
                                     (long)((iVar18 * iVar16 + iVar44) * iVar19 * 8) +
                                     *(long *)&j.img_comp[iVar23].h2,iVar19,local_1b8);
                        }
                      }
                    }
                    j.order[3] = j.order[3] + -1;
                    if (iVar23 < 2) {
                      if (j.img_comp[3].coeff_h < 0x18) {
                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a18);
                      }
                      if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011f71f;
                      j.img_comp[3].coeff_w = 0;
                      j.img_comp[3].coeff_h = 0;
                      j.code_bits = 0;
                      j.img_comp[2].hd = 0;
                      j.img_comp[1].hd = 0;
                      j.img_comp[0].hd = 0;
                      j.code_buffer._0_1_ = 0xff;
                      j.order[3] = j.order[2];
                      if (j.order[2] == 0) {
                        j.order[3] = 0x7fffffff;
                      }
                      j.succ_high = 0;
                    }
                  }
                }
              }
LAB_0011f71f:
              bVar64 = true;
              goto LAB_0011f6c0;
            }
            if (j.succ_low == 1) {
              lVar30 = (long)j.eob_run;
              iVar52 = j.img_comp[lVar30].ha + 7 >> 3;
              iVar23 = j.img_comp[lVar30].dc_pred + 7 >> 3;
              iVar44 = 0;
              if (iVar52 < 1) {
                iVar52 = iVar44;
              }
              if (iVar23 < 1) {
                iVar23 = iVar44;
              }
              for (; iVar44 != iVar23; iVar44 = iVar44 + 1) {
                for (iVar45 = 0; iVar45 != iVar52; iVar45 = iVar45 + 1) {
                  data_00 = (short *)(j.img_comp[lVar30].linebuf +
                                     (long)((*(int *)&j.img_comp[lVar30].coeff * iVar44 + iVar45) *
                                           0x40) * 2);
                  uVar57 = (ulong)j.nomore;
                  if (uVar57 == 0) {
                    iVar17 = stbi__jpeg_decode_block_prog_dc
                                       ((stbi__jpeg *)local_4a18,data_00,
                                        (stbi__huffman *)
                                        (j.huff_dc[(long)j.img_comp[lVar30].v + -1].delta + 0xf),
                                        iVar16);
                    if (iVar17 == 0) goto LAB_00120828;
                  }
                  else {
                    lVar49 = (long)j.img_comp[lVar30].tq;
                    h = (stbi__huffman *)(j.huff_ac[lVar49 + -1].delta + 0xf);
                    bVar8 = (byte)j.spec_end;
                    if (j.spec_start == 0) {
                      if (j.succ_high == 0) {
                        do {
                          if (j.img_comp[3].coeff_h < 0x10) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a18);
                          }
                          sVar40 = j.fast_ac[lVar49 + -1]
                                   [(ulong)((uint)j.img_comp[3].coeff_w >> 0x17) + 0x1fc];
                          uVar59 = (uint)sVar40;
                          iVar17 = (int)uVar57;
                          if (sVar40 == 0) {
                            uVar59 = stbi__jpeg_huff_decode((stbi__jpeg *)local_4a18,h);
                            if ((int)uVar59 < 0) goto LAB_0011fdda;
                            uVar55 = uVar59 >> 4;
                            if ((uVar59 & 0xf) == 0) {
                              if (uVar59 < 0xf0) {
                                j.succ_high = 1 << ((byte)uVar55 & 0x1f);
                                if (0xf < uVar59) {
                                  iVar17 = stbi__jpeg_get_bits((stbi__jpeg *)local_4a18,uVar55);
                                  j.succ_high = iVar17 + j.succ_high;
                                }
                                goto LAB_0011ef20;
                              }
                              uVar57 = (ulong)(iVar17 + 0x10);
                            }
                            else {
                              lVar48 = (ulong)uVar55 + (long)iVar17;
                              uVar57 = (ulong)((int)lVar48 + 1);
                              bVar9 = ""[lVar48];
                              iVar17 = stbi__extend_receive((stbi__jpeg *)local_4a18,uVar59 & 0xf);
                              data_00[bVar9] = (short)(iVar17 << (bVar8 & 0x1f));
                            }
                          }
                          else {
                            lVar48 = (ulong)(uVar59 >> 4 & 0xf) + (long)iVar17;
                            j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - (uVar59 & 0xf);
                            j.img_comp[3].coeff_w = j.img_comp[3].coeff_w << (sbyte)(uVar59 & 0xf);
                            uVar57 = (ulong)((int)lVar48 + 1);
                            data_00[""[lVar48]] = (short)((uVar59 >> 8) << (bVar8 & 0x1f));
                          }
                        } while ((int)uVar57 <= j.progressive);
                      }
                      else {
LAB_0011ef20:
                        j.succ_high = j.succ_high + -1;
                      }
                    }
                    else if (j.succ_high == 0) {
                      iVar17 = 0x10000 << (bVar8 & 0x1f);
                      do {
                        uVar59 = stbi__jpeg_huff_decode((stbi__jpeg *)local_4a18,h);
                        if ((int)uVar59 < 0) goto LAB_0011fdda;
                        uVar55 = uVar59 >> 4;
                        if ((uVar59 & 0xf) == 1) {
                          iVar18 = stbi__jpeg_get_bit((stbi__jpeg *)local_4a18);
                          iVar19 = 1;
                          if (iVar18 == 0) {
                            iVar19 = 0xffff;
                          }
                          sVar40 = (short)(iVar19 << (bVar8 & 0x1f));
                        }
                        else {
                          if ((uVar59 & 0xf) != 0) goto LAB_0011fdda;
                          if (uVar59 < 0xf0) {
                            j.succ_high = ~(-1 << ((byte)uVar55 & 0x1f));
                            if (0xf < uVar59) {
                              iVar18 = stbi__jpeg_get_bits((stbi__jpeg *)local_4a18,uVar55);
                              j.succ_high = j.succ_high + iVar18;
                            }
                            uVar55 = 0x40;
                          }
                          else {
                            uVar55 = 0xf;
                          }
                          sVar40 = 0;
                        }
                        uVar47 = (long)(int)uVar57;
                        do {
                          while( true ) {
                            uVar57 = uVar47;
                            if ((long)j.progressive < (long)uVar57) goto LAB_0011f044;
                            bVar9 = ""[uVar57];
                            if (data_00[bVar9] == 0) break;
                            iVar18 = stbi__jpeg_get_bit((stbi__jpeg *)local_4a18);
                            if ((iVar18 != 0) &&
                               (sVar2 = data_00[bVar9], (iVar17 >> 0x10 & (int)sVar2) == 0)) {
                              sVar4 = (short)((uint)iVar17 >> 0x10);
                              if (sVar2 < 1) {
                                sVar4 = -sVar4;
                              }
                              data_00[bVar9] = sVar2 + sVar4;
                            }
                            uVar47 = uVar57 + 1;
                          }
                          bVar64 = uVar55 != 0;
                          uVar55 = uVar55 - 1;
                          uVar47 = uVar57 + 1;
                        } while (bVar64);
                        data_00[bVar9] = sVar40;
                        uVar57 = uVar57 + 1;
LAB_0011f044:
                      } while ((int)uVar57 <= j.progressive);
                    }
                    else {
                      j.succ_high = j.succ_high + -1;
                      uVar59 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                      for (; (long)uVar57 <= (long)j.progressive; uVar57 = uVar57 + 1) {
                        bVar8 = ""[uVar57];
                        if (((data_00[bVar8] != 0) &&
                            (iVar17 = stbi__jpeg_get_bit((stbi__jpeg *)local_4a18), iVar17 != 0)) &&
                           (sVar40 = data_00[bVar8], (uVar59 & (int)sVar40) == 0)) {
                          uVar55 = -uVar59;
                          if (0 < sVar40) {
                            uVar55 = uVar59;
                          }
                          data_00[bVar8] = (short)uVar55 + sVar40;
                        }
                      }
                    }
                  }
                  iVar17 = j.order[3];
                  j.order[3] = j.order[3] + -1;
                  if (iVar17 < 2) {
                    if (j.img_comp[3].coeff_h < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a18);
                    }
                    if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011f6ce;
                    j.img_comp[3].coeff_w = 0;
                    j.img_comp[3].coeff_h = 0;
                    j.code_bits = 0;
                    j.img_comp[2].hd = 0;
                    j.img_comp[1].hd = 0;
                    j.img_comp[0].hd = 0;
                    j.code_buffer._0_1_ = 0xff;
                    j.order[3] = j.order[2];
                    if (j.order[2] == 0) {
                      j.order[3] = 0x7fffffff;
                    }
                    j.succ_high = 0;
                  }
                }
              }
            }
            else {
              for (iVar16 = 0; iVar16 < j.img_v_max; iVar16 = iVar16 + 1) {
                for (iVar52 = 0; iVar52 < j.img_h_max; iVar52 = iVar52 + 1) {
                  for (lVar30 = 0; iVar23 = j.order[3], lVar30 < j.succ_low; lVar30 = lVar30 + 1) {
                    iVar23 = j.order[lVar30 + -2];
                    for (iVar44 = 0; iVar44 < j.img_comp[iVar23].id; iVar44 = iVar44 + 1) {
                      iVar45 = 0;
                      while (iVar17 = j.img_comp[(long)iVar23 + -1].coeff_h, iVar45 < iVar17) {
                        iVar17 = stbi__jpeg_decode_block_prog_dc
                                           ((stbi__jpeg *)local_4a18,
                                            (short *)(j.img_comp[iVar23].linebuf +
                                                     (long)((iVar17 * iVar52 + iVar45 +
                                                            (j.img_comp[iVar23].id * iVar16 + iVar44
                                                            ) * *(int *)&j.img_comp[iVar23].coeff) *
                                                           0x40) * 2),
                                            (stbi__huffman *)
                                            (j.huff_dc[(long)j.img_comp[iVar23].v + -1].delta + 0xf)
                                            ,iVar23);
                        iVar45 = iVar45 + 1;
                        if (iVar17 == 0) goto LAB_00120828;
                      }
                    }
                  }
                  j.order[3] = j.order[3] + -1;
                  if (iVar23 < 2) {
                    if (j.img_comp[3].coeff_h < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a18);
                    }
                    if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011f6ce;
                    j.img_comp[3].coeff_w = 0;
                    j.img_comp[3].coeff_h = 0;
                    j.code_bits = 0;
                    j.img_comp[2].hd = 0;
                    j.img_comp[1].hd = 0;
                    j.img_comp[0].hd = 0;
                    j.code_buffer._0_1_ = 0xff;
                    j.order[3] = j.order[2];
                    if (j.order[2] == 0) {
                      j.order[3] = 0x7fffffff;
                    }
                    j.succ_high = 0;
                  }
                }
              }
            }
            goto LAB_0011f6ce;
          }
          stbi__g_failure_reason = "bad SOS len";
        }
        goto LAB_00120828;
      }
      if (bVar8 != 0xd9) {
        iVar16 = stbi__process_marker((stbi__jpeg *)local_4a18,(uint)bVar8);
        if (iVar16 != 0) goto LAB_0011eba3;
        goto LAB_00120828;
      }
      if (j._18216_4_ == 0) {
        uVar59 = *(int *)((long)local_4a18 + 8);
      }
      else {
        for (lVar30 = 0; uVar59 = *(int *)((long)local_4a18 + 8), lVar30 < (int)uVar59;
            lVar30 = lVar30 + 1) {
          uVar59 = j.img_comp[lVar30].ha + 7 >> 3;
          iVar16 = j.img_comp[lVar30].dc_pred + 7 >> 3;
          iVar52 = 0;
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          for (; iVar52 != iVar16; iVar52 = iVar52 + 1) {
            for (uVar57 = 0; uVar57 != uVar59; uVar57 = uVar57 + 1) {
              psVar36 = j.img_comp[lVar30].linebuf;
              iVar44 = *(int *)&j.img_comp[lVar30].coeff * iVar52;
              iVar23 = j.img_comp[lVar30].h;
              iVar45 = iVar44 + (int)uVar57;
              for (lVar49 = 0; lVar49 != 0x40; lVar49 = lVar49 + 1) {
                *(ushort *)(psVar36 + lVar49 * 2 + (long)(iVar45 * 0x40) * 2) =
                     (ushort)j.dequant[(long)iVar23 + -1][lVar49 + 0x38] *
                     *(short *)(psVar36 + lVar49 * 2 + (long)(iVar45 * 0x40) * 2);
              }
              iVar23 = j.img_comp[lVar30].x;
              (*(code *)j._18272_8_)
                        ((long)(iVar52 * 8 * iVar23) + *(long *)&j.img_comp[lVar30].h2 + uVar57 * 8,
                         iVar23,psVar36 + (long)((iVar44 + (int)uVar57) * 0x40) * 2);
            }
          }
        }
      }
      p_Var7 = j.YCbCr_to_RGB_kernel;
      auVar54 = local_4a18;
      if (req_comp == 0) {
        uVar43 = (ulong)uVar59;
      }
      lVar30 = 0;
      uVar57 = 0;
      if (0 < (int)uVar59) {
        uVar57 = (ulong)uVar59;
      }
      iVar16 = (int)uVar43;
      uVar47 = 1;
      if (2 < iVar16) {
        uVar47 = uVar57;
      }
      if (uVar59 != 3) {
        uVar47 = uVar57;
      }
      for (; uVar47 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
        sVar20 = *(stbi__uint32 *)auVar54;
        pvVar32 = malloc((ulong)(sVar20 + 3));
        *(void **)((long)&j.img_comp[0].raw_coeff + lVar30 * 2) = pvVar32;
        if (pvVar32 == (void *)0x0) goto LAB_00120802;
        uVar57 = (long)(int)j.fast_ac[3]._1016_4_ /
                 (long)*(int *)((long)j.img_comp + lVar30 * 2 + -4);
        iVar52 = (int)uVar57;
        *(int *)((long)data + lVar30 + 0x10) = iVar52;
        iVar23 = (int)j.fast_ac[3]._1020_4_ / *(int *)((long)&j.img_comp[0].id + lVar30 * 2);
        *(int *)((long)data + lVar30 + 0x14) = iVar23;
        *(int *)((long)data + lVar30 + 0x1c) = iVar23 >> 1;
        *(int *)((long)data + lVar30 + 0x18) =
             (int)((ulong)((sVar20 + iVar52) - 1) / (uVar57 & 0xffffffff));
        *(undefined4 *)((long)data + lVar30 + 0x20) = 0;
        uVar3 = *(undefined8 *)((long)&j.img_comp[0].h2 + lVar30 * 2);
        *(undefined8 *)((long)data + lVar30 + 8) = uVar3;
        *(undefined8 *)((long)data + lVar30) = uVar3;
        if (iVar52 == 2) {
          pcVar33 = stbi__resample_row_h_2;
          if ((iVar23 != 1) && (pcVar33 = p_Var7, iVar23 != 2)) goto LAB_001205d9;
        }
        else if (iVar52 == 1) {
          pcVar33 = stbi__resample_row_generic;
          if (iVar23 == 2) {
            pcVar33 = stbi__resample_row_v_2;
          }
          if (iVar23 == 1) {
            pcVar33 = resample_row_1;
          }
        }
        else {
LAB_001205d9:
          pcVar33 = stbi__resample_row_generic;
        }
        *(code **)((long)local_1b8 + lVar30) = pcVar33;
      }
      uVar59 = *(stbi__uint32 *)((long)auVar54 + 4);
      puVar34 = (uchar *)malloc((ulong)(*(stbi__uint32 *)auVar54 * iVar16 * uVar59 + 1));
      if (puVar34 != (uchar *)0x0) {
        iVar52 = 0;
        for (uVar55 = 0; uVar55 < uVar59; uVar55 = uVar55 + 1) {
          sVar20 = ((stbi__context *)auVar54)->img_x;
          ppsVar58 = &local_f8;
          for (lVar30 = 0; uVar47 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
            puVar35 = (undefined8 *)((long)data + lVar30 + 8);
            iVar23 = *(int *)((long)data + lVar30 + 0x1c);
            iVar44 = *(int *)((long)data + lVar30 + 0x14);
            iVar45 = iVar44 >> 1;
            puVar38 = puVar35;
            if (iVar23 < iVar45) {
              puVar38 = (undefined8 *)((long)data + lVar30);
            }
            if (iVar45 <= iVar23) {
              puVar35 = (undefined8 *)((long)data + lVar30);
            }
            psVar36 = (stbi_uc *)
                      (**(code **)((long)local_1b8 + lVar30))
                                (*(undefined8 *)((long)&j.img_comp[0].raw_coeff + lVar30 * 2),
                                 *puVar38,*puVar35,*(undefined4 *)((long)data + lVar30 + 0x18),
                                 *(undefined4 *)((long)data + lVar30 + 0x10));
            *ppsVar58 = psVar36;
            *(int *)((long)data + lVar30 + 0x1c) = iVar23 + 1;
            if (iVar44 <= iVar23 + 1) {
              *(undefined4 *)((long)data + lVar30 + 0x1c) = 0;
              lVar49 = *(long *)((long)data + lVar30 + 8);
              *(long *)((long)data + lVar30) = lVar49;
              iVar23 = *(int *)((long)data + lVar30 + 0x20) + 1;
              *(int *)((long)data + lVar30 + 0x20) = iVar23;
              if (iVar23 < *(int *)((long)&j.img_comp[0].dc_pred + lVar30 * 2)) {
                *(long *)((long)data + lVar30 + 8) =
                     lVar49 + *(int *)((long)&j.img_comp[0].x + lVar30 * 2);
              }
            }
            ppsVar58 = ppsVar58 + 1;
          }
          if (iVar16 < 3) {
            if (iVar16 == 1) {
              for (uVar57 = 0; uVar57 < *(stbi__uint32 *)local_4a18; uVar57 = uVar57 + 1) {
                puVar34[uVar57 + sVar20 * iVar52] = local_f8[uVar57];
              }
            }
            else {
              for (uVar57 = 0; uVar57 < *(stbi__uint32 *)local_4a18; uVar57 = uVar57 + 1) {
                puVar34[uVar57 * 2 + (ulong)(sVar20 * iVar52)] = local_f8[uVar57];
                puVar34[uVar57 * 2 + (ulong)(sVar20 * iVar52) + 1] = 0xff;
              }
            }
          }
          else if (*(int *)((long)local_4a18 + 8) == 3) {
            (*j.idct_block_kernel)
                      (puVar34 + uVar55 * iVar16 * sVar20,(int)local_f8,(short *)coutput[0]);
          }
          else {
            puVar42 = puVar34 + (ulong)(sVar20 * iVar52) + 3;
            for (uVar57 = 0; uVar57 < *(stbi__uint32 *)local_4a18; uVar57 = uVar57 + 1) {
              sVar10 = local_f8[uVar57];
              puVar42[-1] = sVar10;
              puVar42[-2] = sVar10;
              puVar42[-3] = sVar10;
              *puVar42 = 0xff;
              puVar42 = puVar42 + uVar43;
            }
          }
          uVar59 = *(stbi__uint32 *)((long)local_4a18 + 4);
          iVar52 = iVar52 + iVar16;
          auVar54 = local_4a18;
        }
        stbi__cleanup_jpeg((stbi__jpeg *)local_4a18);
        *x = *(stbi__uint32 *)local_4a18;
        *y = *(stbi__uint32 *)((long)local_4a18 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)((long)local_4a18 + 8);
          return puVar34;
        }
        return puVar34;
      }
LAB_00120802:
      stbi__cleanup_jpeg((stbi__jpeg *)local_4a18);
      goto LAB_0012080e;
    }
LAB_0011eb35:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      local_4a18 = (undefined1  [8])s;
      iVar16 = stbi__parse_png_file((stbi__png *)local_4a18,0,req_comp);
      auVar54 = local_4a18;
      puVar34 = (uchar *)CONCAT44(j.huff_dc[0].fast._12_4_,j.huff_dc[0].fast._8_4_);
      if (iVar16 == 0) {
        puVar31 = (uchar *)0x0;
      }
      else {
        puVar31 = puVar34;
        if ((req_comp != 0) && (*(int *)((long)local_4a18 + 0xc) != req_comp)) {
          puVar31 = stbi__convert_format
                              (puVar34,*(int *)((long)local_4a18 + 0xc),req_comp,
                               *(stbi__uint32 *)local_4a18,*(stbi__uint32 *)((long)local_4a18 + 4));
          *(int *)((long)auVar54 + 0xc) = req_comp;
          if (puVar31 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = *(stbi__uint32 *)auVar54;
        *y = *(stbi__uint32 *)((long)auVar54 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)((long)auVar54 + 0xc);
        }
        puVar34 = (uchar *)0x0;
      }
      free(puVar34);
      free((void *)CONCAT44(j.huff_dc[0].fast._4_4_,j.huff_dc[0].fast._0_4_));
      free(j.s);
      return puVar31;
    }
    goto LAB_0011eb35;
  }
  sVar10 = stbi__get8(s);
  if ((sVar10 != 'B') || (sVar10 = stbi__get8(s), sVar10 != 'M')) {
    s->img_buffer = s->img_buffer_original;
LAB_0011f877:
    sVar10 = stbi__get8(s);
    if ((((sVar10 == 'G') && (sVar10 = stbi__get8(s), sVar10 == 'I')) &&
        ((sVar10 = stbi__get8(s), sVar10 == 'F' && (sVar10 = stbi__get8(s), sVar10 == '8')))) &&
       ((sVar10 = stbi__get8(s), sVar10 == '7' || (sVar10 == '9')))) {
      sVar10 = stbi__get8(s);
      s->img_buffer = s->img_buffer_original;
      if (sVar10 == 'a') {
        memset((stbi__gif *)local_4a18,0,0x4858);
        iVar16 = stbi__gif_header(s,(stbi__gif *)local_4a18,comp,0);
        psVar37 = (stbi__context *)0x0;
        if (iVar16 == 0) goto LAB_00120c79;
        iVar16 = local_4a18._0_4_;
        iVar52 = local_4a18._4_4_;
        j.s = (stbi__context *)malloc((long)(local_4a18._0_4_ * local_4a18._4_4_ * 4));
        if (j.s == (stbi__context *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          lVar30 = (long)(int)j.huff_dc[0].fast._4_4_;
          for (lVar49 = 0; lVar49 < iVar52 * iVar16 * 4; lVar49 = lVar49 + 4) {
            (j.s)->buffer_start[lVar49 + -0x38] = j.huff_dc[0].fast[lVar30 * 4 + 0x16];
            (j.s)->buffer_start[lVar49 + -0x37] = j.huff_dc[0].fast[lVar30 * 4 + 0x15];
            (j.s)->buffer_start[lVar49 + -0x36] = j.huff_dc[0].fast[lVar30 * 4 + 0x14];
            (j.s)->buffer_start[lVar49 + -0x35] = j.huff_dc[0].fast[lVar30 * 4 + 0x17];
            iVar52 = local_4a18._4_4_;
            iVar16 = local_4a18._0_4_;
          }
          while (sVar10 = stbi__get8(s), sVar10 == '!') {
            sVar10 = stbi__get8(s);
            if (sVar10 == 0xf9) {
              bVar8 = stbi__get8(s);
              if (bVar8 == 4) {
                bVar8 = stbi__get8(s);
                j.huff_dc[0].fast._16_4_ = ZEXT14(bVar8);
                stbi__get16le(s);
                bVar8 = stbi__get8(s);
                j.huff_dc[0].fast._12_4_ = ZEXT14(bVar8);
                goto LAB_0011fe35;
              }
              stbi__skip(s,(uint)bVar8);
            }
            else {
LAB_0011fe35:
              while (bVar8 = stbi__get8(s), bVar8 != 0) {
                stbi__skip(s,(uint)bVar8);
              }
            }
          }
          psVar37 = s;
          if (sVar10 == ';') goto LAB_00120c79;
          if (sVar10 == ',') {
            iVar23 = stbi__get16le(s);
            iVar44 = stbi__get16le(s);
            iVar45 = stbi__get16le(s);
            iVar17 = stbi__get16le(s);
            if ((iVar16 < iVar45 + iVar23) || (iVar52 < iVar17 + iVar44)) {
              stbi__g_failure_reason = "bad Image Descriptor";
            }
            else {
              bVar8 = stbi__get8(s);
              if ((char)bVar8 < '\0') {
                stbi__gif_parse_colortable
                          (s,(stbi_uc (*) [4])(j.huff_dc[0].values + 0x14),2 << (bVar8 & 7),
                           -(uint)((j.huff_dc[0].fast._16_4_ & 1) == 0) | j.huff_dc[0].fast._12_4_);
              }
              else {
                if ((j.huff_dc[0].fast._0_4_ & 0x80) == 0) {
                  stbi__g_failure_reason = "missing color table";
                  goto LAB_00120c77;
                }
                for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 1) {
                  j.huff_dc[0].fast[lVar30 * 4 + 0x17] = 0xff;
                }
                if ((-1 < (long)(int)j.huff_dc[0].fast._12_4_) &&
                   ((j.huff_dc[0].fast._16_4_ & 1) != 0)) {
                  j.huff_dc[0].fast[(long)(int)j.huff_dc[0].fast._12_4_ * 4 + 0x17] = '\0';
                }
              }
              bVar8 = stbi__get8(s);
              if (bVar8 < 0xd) {
                uVar59 = 1 << (bVar8 & 0x1f);
                for (uVar43 = 0; uVar59 != uVar43; uVar43 = uVar43 + 1) {
                  j.huff_dc[1].code[uVar43 * 2 + -0x3e] = 0xffff;
                  *(char *)(j.huff_dc[1].code + uVar43 * 2 + -0x3d) = (char)uVar43;
                  *(char *)((long)j.huff_dc[1].code + uVar43 * 4 + -0x79) = (char)uVar43;
                }
                uVar28 = (2 << (bVar8 & 0x1f)) - 1;
                n = 0;
                iVar52 = 0;
                uVar25 = 0;
                bVar64 = false;
                uVar26 = 0xffffffff;
                uVar27 = uVar59 + 2;
                iVar16 = bVar8 + 1;
                uVar55 = uVar28;
                do {
                  while (uVar29 = uVar55, iVar23 = iVar16, uVar41 = uVar27, uVar46 = uVar26,
                        bVar50 = bVar64, iVar16 = iVar52 - iVar23, iVar23 <= iVar52) {
                    uVar55 = (int)uVar25 >> ((byte)iVar23 & 0x1f);
                    uVar53 = uVar25 & uVar29;
                    iVar52 = iVar16;
                    uVar25 = uVar55;
                    bVar64 = true;
                    uVar26 = 0xffffffff;
                    uVar27 = uVar59 + 2;
                    iVar16 = bVar8 + 1;
                    uVar55 = uVar28;
                    if (uVar53 != uVar59) {
                      if (uVar53 == uVar59 + 1) goto LAB_001218ed;
                      if ((int)uVar41 < (int)uVar53) {
LAB_00121ba3:
                        stbi__g_failure_reason = "illegal code in raster";
                        goto LAB_00120c77;
                      }
                      if (!bVar50) {
                        stbi__g_failure_reason = "no clear code";
                        goto LAB_00120c77;
                      }
                      if ((int)uVar46 < 0) {
                        if (uVar53 == uVar41) goto LAB_00121ba3;
                      }
                      else {
                        if (0xfff < (int)uVar41) {
                          stbi__g_failure_reason = "too many codes";
                          goto LAB_00120c77;
                        }
                        lVar30 = (long)(int)uVar41;
                        uVar41 = uVar41 + 1;
                        j.huff_dc[1].code[lVar30 * 2 + -0x3e] = (stbi__uint16)uVar46;
                        uVar15 = (undefined1)j.huff_dc[1].code[(ulong)uVar46 * 2 + -0x3d];
                        *(undefined1 *)(j.huff_dc[1].code + lVar30 * 2 + -0x3d) = uVar15;
                        if (uVar53 != uVar41) {
                          uVar15 = (undefined1)j.huff_dc[1].code[(long)(int)uVar53 * 2 + -0x3d];
                        }
                        *(undefined1 *)((long)j.huff_dc[1].code + lVar30 * 4 + -0x79) = uVar15;
                      }
                      stbi__out_gif_code((stbi__gif *)local_4a18,(stbi__uint16)uVar53);
                      iVar16 = iVar23 + 1;
                      uVar55 = ~(-1 << ((byte)iVar16 & 0x1f));
                      if (0xfff < (int)uVar41 || (uVar41 & uVar29) != 0) {
                        uVar55 = uVar29;
                        iVar16 = iVar23;
                      }
                      bVar64 = true;
                      uVar26 = uVar53;
                      uVar27 = uVar41;
                    }
                  }
                  if (n == 0) {
                    bVar9 = stbi__get8(s);
                    if (bVar9 == 0) goto LAB_00121908;
                    n = (uint)bVar9;
                  }
                  n = n - 1;
                  bVar9 = stbi__get8(s);
                  bVar12 = (byte)iVar52;
                  iVar52 = iVar52 + 8;
                  uVar25 = uVar25 | (uint)bVar9 << (bVar12 & 0x1f);
                  bVar64 = bVar50;
                  uVar26 = uVar46;
                  uVar27 = uVar41;
                  iVar16 = iVar23;
                  uVar55 = uVar29;
                } while( true );
              }
            }
          }
          else {
            stbi__g_failure_reason = "unknown code";
          }
        }
LAB_00120c77:
        psVar37 = (stbi__context *)0x0;
LAB_00120c79:
        psVar62 = (stbi__context *)0x0;
        if (psVar37 != s) {
          psVar62 = psVar37;
        }
        if (psVar62 != (stbi__context *)0x0) {
          *x = local_4a18._0_4_;
          *y = local_4a18._4_4_;
          return (uchar *)psVar62;
        }
        return (uchar *)(stbi__context *)0x0;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
    }
    sVar20 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    if (sVar20 == 0x38425053) {
      sVar20 = stbi__get32be(s);
      if (sVar20 != 0x38425053) {
        stbi__g_failure_reason = "not PSD";
        return (uchar *)0x0;
      }
      iVar16 = stbi__get16be(s);
      if (iVar16 != 1) {
        stbi__g_failure_reason = "wrong version";
        return (uchar *)0x0;
      }
      stbi__skip(s,6);
      uVar59 = stbi__get16be(s);
      if (0x10 < uVar59) {
        stbi__g_failure_reason = "wrong channel count";
        return (uchar *)0x0;
      }
      sVar20 = stbi__get32be(s);
      sVar21 = stbi__get32be(s);
      iVar16 = stbi__get16be(s);
      if (iVar16 != 8) {
        stbi__g_failure_reason = "unsupported bit depth";
        return (uchar *)0x0;
      }
      iVar16 = stbi__get16be(s);
      if (iVar16 != 3) {
        stbi__g_failure_reason = "wrong color format";
        return (uchar *)0x0;
      }
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      uVar55 = stbi__get16be(s);
      if (1 < uVar55) {
        stbi__g_failure_reason = "bad compression";
        return (uchar *)0x0;
      }
      iVar16 = sVar20 * sVar21;
      puVar34 = (uchar *)malloc((long)(iVar16 * 4));
      if (puVar34 != (uchar *)0x0) {
        if (uVar55 == 0) {
          uVar43 = 0;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          puVar31 = puVar34;
          for (; uVar43 != 4; uVar43 = uVar43 + 1) {
            if (uVar59 < uVar43) {
              for (lVar30 = 0; iVar16 != (int)lVar30; lVar30 = lVar30 + 1) {
                puVar31[lVar30 * 4] = -(uVar43 == 3);
              }
            }
            else {
              for (lVar30 = 0; iVar16 != (int)lVar30; lVar30 = lVar30 + 1) {
                sVar10 = stbi__get8(s);
                puVar31[lVar30 * 4] = sVar10;
              }
            }
            puVar31 = puVar31 + 1;
          }
        }
        else {
          stbi__skip(s,uVar59 * sVar20 * 2);
          uVar43 = 0;
          iVar52 = 0;
          if (0 < iVar16) {
            iVar52 = iVar16;
          }
          local_40 = puVar34;
          for (; uVar43 != 4; uVar43 = uVar43 + 1) {
            if (uVar43 < uVar59) {
              psVar36 = puVar34 + uVar43;
              iVar23 = 0;
              while (iVar23 < iVar16) {
                bVar8 = stbi__get8(s);
                if (bVar8 != 0x80) {
                  if ((char)bVar8 < '\0') {
                    iVar44 = 0x101 - (uint)bVar8;
                    sVar10 = stbi__get8(s);
                    for (iVar45 = bVar8 - 0x101; iVar45 != 0; iVar45 = iVar45 + 1) {
                      *psVar36 = sVar10;
                      psVar36 = psVar36 + 4;
                    }
                  }
                  else {
                    iVar44 = bVar8 + 1;
                    iVar45 = iVar44;
                    while (bVar64 = iVar45 != 0, iVar45 = iVar45 + -1, bVar64) {
                      sVar10 = stbi__get8(s);
                      *psVar36 = sVar10;
                      psVar36 = psVar36 + 4;
                    }
                  }
                  iVar23 = iVar23 + iVar44;
                }
              }
            }
            else {
              for (lVar30 = 0; iVar52 != (int)lVar30; lVar30 = lVar30 + 1) {
                local_40[lVar30 * 4] = -(uVar43 == 3);
              }
            }
            local_40 = local_40 + 1;
          }
        }
        if (((req_comp & 0xfffffffbU) != 0) &&
           (puVar34 = stbi__convert_format(puVar34,4,req_comp,sVar21,sVar20),
           puVar34 == (uchar *)0x0)) {
          return (uchar *)0x0;
        }
        if (comp != (int *)0x0) {
          *comp = uVar59;
        }
        *y = sVar20;
        *x = sVar21;
        return puVar34;
      }
      goto LAB_0012080e;
    }
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_213cf);
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
    }
    else {
      iVar16 = 0x54;
      while (bVar64 = iVar16 != 0, iVar16 = iVar16 + -1, bVar64) {
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar64 = iVar16 != 0, iVar16 = iVar16 + -1, bVar64) {
          stbi__get8(s);
        }
        uVar59 = stbi__get16be(s);
        uVar55 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          stbi__g_failure_reason = "bad file";
          return (uchar *)0x0;
        }
        bVar8 = 0;
        if ((uint)(0x10000000 / (ulong)uVar59) < uVar55) {
          stbi__g_failure_reason = "too large";
          return (uchar *)0x0;
        }
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        uVar43 = (ulong)(uVar59 * 4 * uVar55);
        puVar34 = (uchar *)malloc(uVar43);
        memset(puVar34,0xff,uVar43);
        pbVar61 = local_4a18 + 2;
        lVar30 = 0;
        do {
          if (lVar30 == 10) goto LAB_0012088c;
          sVar10 = stbi__get8(s);
          bVar9 = stbi__get8(s);
          pbVar61[-2] = bVar9;
          bVar12 = stbi__get8(s);
          pbVar61[-1] = bVar12;
          bVar12 = stbi__get8(s);
          *pbVar61 = bVar12;
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_001208f4;
          if (bVar9 != 8) goto LAB_0012088c;
          bVar8 = bVar8 | bVar12;
          pbVar61 = pbVar61 + 3;
          lVar30 = lVar30 + 1;
        } while (sVar10 != '\0');
        *comp = 4 - (uint)((bVar8 & 0x10) == 0);
        for (uVar43 = 0; uVar43 != uVar55; uVar43 = uVar43 + 1) {
          puVar31 = puVar34 + (int)(uVar59 * 4 * (int)uVar43);
          for (lVar49 = 0; lVar30 != lVar49; lVar49 = lVar49 + 1) {
            lVar48 = lVar49 * 3;
            sVar10 = j.huff_dc[0].fast[lVar48 + -0xf];
            if (sVar10 == '\0') {
              bVar8 = j.huff_dc[0].fast[lVar48 + -0xe];
              puVar63 = puVar31;
              uVar25 = uVar59;
              while (bVar64 = uVar25 != 0, uVar25 = uVar25 - 1, bVar64) {
                psVar36 = stbi__readval(s,(uint)bVar8,puVar63);
                if (psVar36 == (stbi_uc *)0x0) goto LAB_00120902;
                puVar63 = puVar63 + 4;
              }
            }
            else {
              puVar63 = puVar31;
              uVar25 = uVar59;
              if (sVar10 == '\x01') {
                for (; 0 < (int)uVar25; uVar25 = uVar25 - (uVar26 & 0xff)) {
                  bVar8 = stbi__get8(s);
                  iVar16 = stbi__at_eof(s);
                  if (iVar16 != 0) goto LAB_001208f4;
                  psVar36 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar48 + -0xe],
                                          (stbi_uc *)local_1b8);
                  if (psVar36 == (stbi_uc *)0x0) goto LAB_00120902;
                  uVar26 = (uint)bVar8;
                  if (uVar25 < bVar8) {
                    uVar26 = uVar25;
                  }
                  uVar27 = uVar26 & 0xff;
                  while (bVar64 = uVar27 != 0, uVar27 = uVar27 - 1, bVar64) {
                    stbi__copyval((uint)j.huff_dc[0].fast[lVar48 + -0xe],puVar63,
                                  (stbi_uc *)local_1b8);
                    puVar63 = puVar63 + 4;
                  }
                }
              }
              else {
                if (sVar10 != '\x02') goto LAB_0012088c;
                for (; 0 < (int)uVar25; uVar25 = uVar25 - iVar16) {
                  bVar8 = stbi__get8(s);
                  iVar16 = stbi__at_eof(s);
                  if (iVar16 != 0) goto LAB_001208f4;
                  uVar26 = (uint)bVar8;
                  if ((char)bVar8 < '\0') {
                    if (uVar26 == 0x80) {
                      iVar16 = stbi__get16be(s);
                    }
                    else {
                      iVar16 = uVar26 - 0x7f;
                    }
                    if ((int)uVar25 < iVar16) goto LAB_001208f4;
                    psVar36 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar48 + -0xe],
                                            (stbi_uc *)local_1b8);
                    iVar52 = iVar16;
                    if (psVar36 == (stbi_uc *)0x0) goto LAB_00120902;
                    while (iVar52 != 0) {
                      stbi__copyval((uint)j.huff_dc[0].fast[lVar48 + -0xe],puVar63,
                                    (stbi_uc *)local_1b8);
                      puVar63 = puVar63 + 4;
                      iVar52 = iVar52 + -1;
                    }
                  }
                  else {
                    iVar16 = bVar8 + 1;
                    iVar52 = iVar16;
                    if (uVar25 <= uVar26) goto LAB_001208f4;
                    while (bVar64 = iVar52 != 0, iVar52 = iVar52 + -1, bVar64) {
                      psVar36 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar48 + -0xe],puVar63);
                      if (psVar36 == (stbi_uc *)0x0) goto LAB_00120902;
                      puVar63 = puVar63 + 4;
                    }
                  }
                }
              }
            }
          }
        }
        if (puVar34 != (uchar *)0x0) goto LAB_0012091c;
        goto LAB_00120902;
      }
    }
    sVar10 = stbi__get8(s);
    sVar11 = stbi__get8(s);
    if ((sVar10 == 'P') && (0xfd < (byte)(sVar11 - 0x37))) {
      iVar16 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
      if (iVar16 == 0) {
        return (uchar *)0x0;
      }
      *x = s->img_x;
      *y = s->img_y;
      iVar16 = s->img_n;
      *comp = iVar16;
      uVar59 = iVar16 * s->img_x * s->img_y;
      puVar34 = (uchar *)malloc((ulong)uVar59);
      if (puVar34 != (uchar *)0x0) {
        stbi__getn(s,puVar34,uVar59);
        if (req_comp == 0) {
          return puVar34;
        }
        iVar16 = s->img_n;
        if (iVar16 != req_comp) {
          puVar34 = stbi__convert_format(puVar34,iVar16,req_comp,s->img_x,s->img_y);
          return puVar34;
        }
        return puVar34;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 == 0) {
        stbi__get8(s);
        bVar8 = stbi__get8(s);
        if ((bVar8 < 2) && (bVar8 = stbi__get8(s), 0xfc < (byte)((bVar8 & 0xf7) - 4))) {
          stbi__get16be(s);
          stbi__get16be(s);
          stbi__get8(s);
          stbi__get16be(s);
          stbi__get16be(s);
          iVar16 = stbi__get16be(s);
          if ((iVar16 != 0) && (iVar16 = stbi__get16be(s), iVar16 != 0)) {
            sVar10 = stbi__get8(s);
            s->img_buffer = s->img_buffer_original;
            if ((sVar10 - 8 & 0xe7) == 0) {
              bVar8 = stbi__get8(s);
              sVar10 = stbi__get8(s);
              bVar9 = stbi__get8(s);
              iVar16 = stbi__get16le(s);
              uVar55 = stbi__get16le(s);
              bVar12 = stbi__get8(s);
              stbi__get16le(s);
              stbi__get16le(s);
              uVar25 = stbi__get16le(s);
              uVar26 = stbi__get16le(s);
              bVar13 = stbi__get8(s);
              bVar14 = stbi__get8(s);
              uVar59 = bVar9 - 8;
              if (bVar9 < 8) {
                uVar59 = (uint)bVar9;
              }
              if (uVar25 == 0) {
                return (uchar *)0x0;
              }
              if (uVar26 == 0) {
                return (uchar *)0x0;
              }
              if (uVar59 - 4 < 0xfffffffd) {
                return (uchar *)0x0;
              }
              if (3 < (byte)(bVar13 << 5 | (byte)(bVar13 - 8) >> 3)) {
                return (uchar *)0x0;
              }
              bVar5 = bVar13 >> 3;
              bVar6 = bVar12 >> 3;
              if (sVar10 == '\0') {
                bVar6 = bVar5;
              }
              uVar43 = (ulong)bVar6;
              *x = uVar25;
              *y = uVar26;
              uVar59 = (uint)bVar6;
              if (comp != (int *)0x0) {
                *comp = uVar59;
              }
              uVar57 = (ulong)(uVar26 * uVar25);
              puVar34 = (uchar *)malloc(uVar43 * uVar57);
              if (puVar34 != (uchar *)0x0) {
                stbi__skip(s,(uint)bVar8);
                if (bVar9 < 8 && sVar10 == '\0') {
                  iVar16 = bVar5 * uVar25;
                  uVar27 = 0;
                  uVar55 = uVar26;
                  while (uVar55 = uVar55 - 1, uVar55 != 0xffffffff) {
                    uVar28 = uVar27;
                    if ((bVar14 >> 5 & 1) == 0) {
                      uVar28 = uVar55;
                    }
                    stbi__getn(s,puVar34 + (int)(uVar28 * iVar16),iVar16);
                    uVar27 = uVar27 + 1;
                  }
                }
                else {
                  if (sVar10 == '\0') {
                    local_50 = (stbi_uc *)0x0;
                  }
                  else {
                    stbi__skip(s,iVar16);
                    uVar27 = bVar12 * uVar55 >> 3;
                    local_50 = (stbi_uc *)malloc((ulong)uVar27);
                    if (local_50 == (stbi_uc *)0x0) {
                      free(puVar34);
                      goto LAB_00121b88;
                    }
                    iVar16 = stbi__getn(s,local_50,uVar27);
                    if (iVar16 == 0) {
                      free(puVar34);
                      free(local_50);
                      stbi__g_failure_reason = "bad palette";
                      return (uchar *)0x0;
                    }
                  }
                  uVar47 = (ulong)(bVar13 + 7 >> 3);
                  bVar64 = true;
                  iVar16 = 0;
                  uVar27 = 0;
                  puVar31 = puVar34;
                  for (uVar56 = 0; uVar56 != uVar57; uVar56 = uVar56 + 1) {
                    if (bVar9 < 8) {
LAB_00121a16:
                      if (sVar10 == '\0') {
                        for (uVar39 = 0; uVar47 != uVar39; uVar39 = uVar39 + 1) {
                          sVar11 = stbi__get8(s);
                          j.huff_dc[0].fast[uVar39 - 0x10] = sVar11;
                        }
                      }
                      else {
                        bVar8 = stbi__get8(s);
                        uVar28 = (uint)bVar8;
                        if (uVar55 <= bVar8) {
                          uVar28 = 0;
                        }
                        for (uVar39 = 0; uVar47 != uVar39; uVar39 = uVar39 + 1) {
                          j.huff_dc[0].fast[uVar39 - 0x10] = local_50[uVar39 + uVar28 * bVar5];
                        }
                      }
                    }
                    else {
                      if (iVar16 == 0) {
                        bVar8 = stbi__get8(s);
                        iVar16 = (bVar8 & 0x7f) + 1;
                        uVar27 = (uint)(bVar8 >> 7);
                        goto LAB_00121a16;
                      }
                      if (uVar27 == 0 || bVar64) {
                        uVar27 = (uint)(uVar27 != 0);
                        goto LAB_00121a16;
                      }
                      uVar27 = 1;
                    }
                    for (uVar39 = 0; uVar43 != uVar39; uVar39 = uVar39 + 1) {
                      puVar31[uVar39] = j.huff_dc[0].fast[uVar39 - 0x10];
                    }
                    iVar16 = iVar16 + -1;
                    puVar31 = puVar31 + uVar43;
                    bVar64 = false;
                  }
                  if ((bVar14 >> 5 & 1) == 0) {
                    iVar16 = uVar25 * uVar59;
                    iVar52 = (uVar26 - 1) * iVar16;
                    uVar55 = 0;
                    for (uVar27 = 0; uVar27 != uVar26 + 1 >> 1; uVar27 = uVar27 + 1) {
                      puVar31 = puVar34;
                      for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
                        uVar15 = puVar31[uVar55];
                        puVar31[uVar55] = puVar31[iVar52];
                        puVar31[iVar52] = uVar15;
                        puVar31 = puVar31 + 1;
                      }
                      uVar55 = uVar55 + iVar16;
                      iVar52 = iVar52 - iVar16;
                    }
                  }
                  free(local_50);
                }
                if (2 < uVar59) {
                  puVar31 = puVar34 + 2;
                  while (iVar16 = (int)uVar57, uVar57 = (ulong)(iVar16 - 1), iVar16 != 0) {
                    uVar1 = puVar31[-2];
                    puVar31[-2] = *puVar31;
                    *puVar31 = uVar1;
                    puVar31 = puVar31 + uVar43;
                  }
                }
                if (req_comp != 0) {
                  if (uVar59 != req_comp) {
                    puVar34 = stbi__convert_format(puVar34,uVar59,req_comp,uVar25,uVar26);
                    return puVar34;
                  }
                  return puVar34;
                }
                return puVar34;
              }
LAB_00121b88:
              stbi__g_failure_reason = "outofmem";
              return (uchar *)0x0;
            }
          }
        }
        stbi__g_failure_reason = "unknown image type";
        return (uchar *)0x0;
      }
      __ptr = stbi__hdr_load(s,x,y,comp,req_comp);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar59 = *y * *x;
      puVar34 = (uchar *)malloc((long)(int)(req_comp * uVar59));
      if (puVar34 != (uchar *)0x0) {
        uVar55 = (req_comp + (req_comp & 1U)) - 1;
        uVar57 = 0;
        uVar43 = (ulong)uVar55;
        if ((int)uVar55 < 1) {
          uVar43 = uVar57;
        }
        lVar30 = (long)req_comp;
        puVar31 = puVar34;
        pfVar60 = __ptr;
        uVar47 = (ulong)uVar59;
        if ((int)uVar59 < 1) {
          uVar47 = uVar57;
        }
        for (; uVar57 != uVar47; uVar57 = uVar57 + 1) {
          for (uVar56 = 0; uVar43 != uVar56; uVar56 = uVar56 + 1) {
            fVar65 = powf(pfVar60[uVar56] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
            fVar66 = fVar65 * 255.0 + 0.5;
            fVar65 = 0.0;
            if (0.0 <= fVar66) {
              fVar65 = fVar66;
            }
            fVar66 = 255.0;
            if (fVar65 <= 255.0) {
              fVar66 = fVar65;
            }
            puVar31[uVar56] = (char)(int)fVar66;
          }
          if ((int)uVar43 < req_comp) {
            lVar49 = uVar57 * lVar30 + uVar43;
            fVar66 = __ptr[lVar49] * 255.0 + 0.5;
            fVar65 = 0.0;
            if (0.0 <= fVar66) {
              fVar65 = fVar66;
            }
            fVar66 = 255.0;
            if (fVar65 <= 255.0) {
              fVar66 = fVar65;
            }
            puVar34[lVar49] = (char)(int)fVar66;
          }
          puVar31 = puVar31 + lVar30;
          pfVar60 = pfVar60 + lVar30;
        }
        free(__ptr);
        return puVar34;
      }
      free(__ptr);
    }
    goto LAB_0012080e;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get32le(s);
  sVar20 = stbi__get32le(s);
  if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
     (sVar20 == 0x6c)) {
    s->img_buffer = s->img_buffer_original;
  }
  else {
    s->img_buffer = s->img_buffer_original;
    if (sVar20 != 0x7c) goto LAB_0011f877;
  }
  sVar10 = stbi__get8(s);
  if ((sVar10 != 'B') || (sVar10 = stbi__get8(s), sVar10 != 'M')) {
    stbi__g_failure_reason = "not BMP";
    return (uchar *)0x0;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  sVar20 = stbi__get32le(s);
  sVar21 = stbi__get32le(s);
  if ((((0x38 < sVar21) || ((0x100010000001000U >> ((ulong)sVar21 & 0x3f) & 1) == 0)) &&
      (sVar21 != 0x6c)) && (sVar21 != 0x7c)) {
    stbi__g_failure_reason = "unknown BMP";
    return (uchar *)0x0;
  }
  if (sVar21 == 0xc) {
    sVar22 = stbi__get16le(s);
    s->img_x = sVar22;
    sVar22 = stbi__get16le(s);
  }
  else {
    sVar22 = stbi__get32le(s);
    s->img_x = sVar22;
    sVar22 = stbi__get32le(s);
  }
  s->img_y = sVar22;
  iVar16 = stbi__get16le(s);
  if (iVar16 != 1) goto LAB_00121355;
  uVar59 = stbi__get16le(s);
  if (uVar59 == 1) {
    stbi__g_failure_reason = "monochrome";
    return (uchar *)0x0;
  }
  sVar22 = s->img_y;
  sVar24 = -sVar22;
  if (0 < (int)sVar22) {
    sVar24 = sVar22;
  }
  s->img_y = sVar24;
  if (sVar21 == 0xc) {
    z = 0;
    if (uVar59 < 0x18) {
      uVar43 = (long)(int)(sVar20 - 0x26) / 3 & 0xffffffff;
    }
    else {
      uVar43 = 0;
    }
    uVar55 = 0;
    uVar25 = 0;
    uVar26 = 0;
  }
  else {
    sVar24 = stbi__get32le(s);
    if (sVar24 - 1 < 2) {
      stbi__g_failure_reason = "BMP RLE";
      return (uchar *)0x0;
    }
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    if (sVar21 == 0x28) {
LAB_00120b93:
      if (uVar59 != 0x20) {
        z = 0;
        uVar55 = 0;
        uVar25 = 0;
        uVar26 = 0;
        if (uVar59 != 0x10) goto LAB_00121079;
      }
      if (sVar24 != 3) {
        if (sVar24 != 0) {
LAB_00121355:
          stbi__g_failure_reason = "bad BMP";
          return (uchar *)0x0;
        }
        bVar64 = uVar59 != 0x20;
        uVar55 = 0x1f;
        if (!bVar64) {
          uVar55 = 0xff;
        }
        uVar25 = 0x3e0;
        if (!bVar64) {
          uVar25 = 0xff00;
        }
        uVar26 = 0x7c00;
        if (!bVar64) {
          uVar26 = 0xff0000;
        }
        z = (uint)bVar64 * 0x1000000 - 0x1000000;
        goto LAB_00121090;
      }
      uVar26 = stbi__get32le(s);
      uVar25 = stbi__get32le(s);
      uVar55 = stbi__get32le(s);
      if (uVar25 == uVar55 && uVar26 == uVar25) goto LAB_00121355;
      uVar43 = 0;
      z = 0;
    }
    else {
      if (sVar21 == 0x38) {
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        goto LAB_00120b93;
      }
      if ((sVar21 | 0x10) != 0x7c) {
        __assert_fail("hsz == 108 || hsz == 124",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                      ,0x1229,"stbi_uc *stbi__bmp_load(stbi__context *, int *, int *, int *, int)");
      }
      uVar26 = stbi__get32le(s);
      uVar25 = stbi__get32le(s);
      uVar55 = stbi__get32le(s);
      z = stbi__get32le(s);
      stbi__get32le(s);
      iVar16 = 0xc;
      while (bVar64 = iVar16 != 0, iVar16 = iVar16 + -1, bVar64) {
        stbi__get32le(s);
      }
      if (sVar21 == 0x7c) {
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
      }
LAB_00121079:
      if (uVar59 < 0x10) {
        uVar43 = (ulong)(uint)((int)((sVar20 - sVar21) + -0xe) >> 2);
      }
      else {
LAB_00121090:
        uVar43 = 0;
      }
    }
  }
  iVar16 = 4 - (uint)(z == 0);
  s->img_n = iVar16;
  if (2 < req_comp) {
    iVar16 = req_comp;
  }
  puVar34 = (uchar *)malloc((ulong)(s->img_x * iVar16 * s->img_y));
  if (puVar34 == (uchar *)0x0) {
LAB_0012080e:
    stbi__g_failure_reason = "outofmem";
    return (uchar *)0x0;
  }
  if (uVar59 < 0x10) {
    iVar52 = (int)uVar43;
    if (0x100 < iVar52 || iVar52 == 0) {
      free(puVar34);
      stbi__g_failure_reason = "invalid";
      return (uchar *)0x0;
    }
    uVar47 = 0;
    uVar57 = 0;
    if (0 < iVar52) {
      uVar57 = uVar43;
    }
    for (; uVar57 != uVar47; uVar47 = uVar47 + 1) {
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar47 * 4 + -0xe] = sVar10;
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar47 * 4 + -0xf] = sVar10;
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar47 * 4 + -0x10] = sVar10;
      if (sVar21 != 0xc) {
        stbi__get8(s);
      }
      j.huff_dc[0].fast[uVar47 * 4 + -0xd] = 0xff;
    }
    stbi__skip(s,(sVar20 - sVar21) + iVar52 * (sVar21 == 0xc | 0xfffffffc) + -0xe);
    if (uVar59 == 4) {
      uVar55 = s->img_x + 1 >> 1;
    }
    else {
      if (uVar59 != 8) {
        free(puVar34);
        stbi__g_failure_reason = "bad bpp";
        return (uchar *)0x0;
      }
      uVar55 = s->img_x;
    }
    uVar43 = 0;
    local_60 = -uVar55 & 3;
    for (iVar52 = 0; sVar20 = s->img_y, iVar52 < (int)sVar20; iVar52 = iVar52 + 1) {
      for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 2) {
        bVar8 = stbi__get8(s);
        uVar25 = bVar8 & 0xf;
        uVar55 = (uint)(bVar8 >> 4);
        if (uVar59 != 4) {
          uVar55 = (uint)bVar8;
        }
        uVar57 = (ulong)uVar55;
        if (uVar59 != 4) {
          uVar25 = 0;
        }
        lVar30 = (long)(int)uVar43;
        uVar47 = lVar30 + 3;
        puVar34[lVar30] = j.huff_dc[0].fast[uVar57 * 4 + -0x10];
        puVar34[lVar30 + 1] = j.huff_dc[0].fast[uVar57 * 4 + -0xf];
        puVar34[lVar30 + 2] = j.huff_dc[0].fast[uVar57 * 4 + -0xe];
        if (iVar16 == 4) {
          puVar34[lVar30 + 3] = 0xff;
          uVar47 = (ulong)((int)uVar43 + 4);
        }
        if (iVar23 + 1U == s->img_x) {
          uVar43 = uVar47 & 0xffffffff;
          break;
        }
        if (uVar59 == 8) {
          bVar8 = stbi__get8(s);
          uVar25 = (uint)bVar8;
        }
        lVar30 = (long)(int)uVar47;
        uVar43 = lVar30 + 3;
        uVar57 = (ulong)uVar25;
        puVar34[lVar30] = j.huff_dc[0].fast[uVar57 * 4 + -0x10];
        puVar34[lVar30 + 1] = j.huff_dc[0].fast[uVar57 * 4 + -0xf];
        puVar34[lVar30 + 2] = j.huff_dc[0].fast[uVar57 * 4 + -0xe];
        if (iVar16 == 4) {
          puVar34[lVar30 + 3] = 0xff;
          uVar43 = (ulong)((int)uVar47 + 4);
        }
      }
      stbi__skip(s,local_60);
    }
    goto LAB_0012159b;
  }
  stbi__skip(s,(sVar20 - sVar21) + -0xe);
  if (uVar59 == 0x20) {
    local_ac = 0;
    if (((z == 0xff000000) && (uVar55 == 0xff)) && ((uVar25 == 0xff00 && (uVar26 == 0xff0000)))) {
      coutput[3]._4_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      goto LAB_00121101;
    }
LAB_00121365:
    if (((uVar55 == 0) || (uVar25 == 0)) || (uVar26 == 0)) {
      free(puVar34);
      stbi__g_failure_reason = "bad masks";
      return (uchar *)0x0;
    }
    iVar52 = stbi__high_bit(uVar26);
    iVar52 = iVar52 + -7;
    iVar23 = stbi__bitcount(uVar26);
    iVar44 = stbi__high_bit(uVar25);
    iVar44 = iVar44 + -7;
    coutput[3]._0_4_ = stbi__bitcount(uVar25);
    local_88 = stbi__high_bit(uVar55);
    local_88 = local_88 + -7;
    local_d0 = stbi__bitcount(uVar55);
    local_cc = stbi__high_bit(z);
    local_cc = local_cc + -7;
    local_c8 = stbi__bitcount(z);
    bVar64 = true;
    coutput[3]._4_4_ = 0;
  }
  else {
    if (uVar59 != 0x18) {
      local_ac = 0;
      if (uVar59 == 0x10) {
        local_ac = s->img_x * 2 & 2;
      }
      goto LAB_00121365;
    }
    local_ac = s->img_x & 3;
    coutput[3]._4_4_ = 0;
LAB_00121101:
    bVar64 = false;
    iVar52 = 0;
    iVar44 = 0;
    local_88 = 0;
    local_cc = 0;
    iVar23 = 0;
    coutput[3]._0_4_ = 0;
    local_d0 = 0;
    local_c8 = 0;
  }
  iVar45 = 0;
  for (iVar17 = 0; sVar20 = s->img_y, iVar17 < (int)sVar20; iVar17 = iVar17 + 1) {
    if (bVar64) {
      for (iVar18 = 0; iVar18 < (int)s->img_x; iVar18 = iVar18 + 1) {
        if (uVar59 == 0x10) {
          uVar27 = stbi__get16le(s);
        }
        else {
          uVar27 = stbi__get32le(s);
        }
        iVar19 = stbi__shiftsigned(uVar27 & uVar26,iVar52,iVar23);
        puVar34[iVar45] = (char)iVar19;
        iVar19 = stbi__shiftsigned(uVar27 & uVar25,iVar44,(int)coutput[3]);
        puVar34[(long)iVar45 + 1] = (char)iVar19;
        iVar19 = stbi__shiftsigned(uVar27 & uVar55,local_88,local_d0);
        puVar34[(long)iVar45 + 2] = (char)iVar19;
        if (z == 0) {
          uVar15 = 0xff;
        }
        else {
          iVar19 = stbi__shiftsigned(uVar27 & z,local_cc,local_c8);
          uVar15 = (undefined1)iVar19;
        }
        iVar19 = iVar45 + 3;
        if (iVar16 == 4) {
          puVar34[(long)iVar45 + 3] = uVar15;
          iVar19 = iVar45 + 4;
        }
        iVar45 = iVar19;
      }
    }
    else {
      for (iVar18 = 0; iVar18 < (int)s->img_x; iVar18 = iVar18 + 1) {
        sVar10 = stbi__get8(s);
        puVar34[(long)iVar45 + 2] = sVar10;
        sVar10 = stbi__get8(s);
        puVar34[(long)iVar45 + 1] = sVar10;
        sVar10 = stbi__get8(s);
        puVar34[iVar45] = sVar10;
        sVar10 = 0xff;
        if (coutput[3]._4_1_ != '\0') {
          sVar10 = stbi__get8(s);
        }
        iVar19 = iVar45 + 3;
        if (iVar16 == 4) {
          puVar34[(long)iVar45 + 3] = sVar10;
          iVar19 = iVar45 + 4;
        }
        iVar45 = iVar19;
      }
    }
    stbi__skip(s,local_ac);
  }
LAB_0012159b:
  if (0 < (int)sVar22) {
    iVar52 = (int)sVar20 >> 1;
    if ((int)sVar20 >> 1 < 1) {
      iVar52 = 0;
    }
    iVar44 = (sVar20 - 1) * iVar16;
    iVar23 = 0;
    for (iVar45 = 0; iVar45 != iVar52; iVar45 = iVar45 + 1) {
      sVar21 = s->img_x;
      uVar59 = sVar21 * iVar16;
      if ((int)(sVar21 * iVar16) < 1) {
        uVar59 = 0;
      }
      for (uVar43 = 0; uVar59 != uVar43; uVar43 = uVar43 + 1) {
        uVar15 = puVar34[uVar43 + sVar21 * iVar23];
        puVar34[uVar43 + sVar21 * iVar23] = puVar34[uVar43 + sVar21 * iVar44];
        puVar34[uVar43 + sVar21 * iVar44] = uVar15;
      }
      iVar44 = iVar44 - iVar16;
      iVar23 = iVar23 + iVar16;
    }
  }
  uVar59 = s->img_x;
  if ((req_comp != 0) && (iVar16 != req_comp)) {
    puVar34 = stbi__convert_format(puVar34,iVar16,req_comp,uVar59,sVar20);
    if (puVar34 == (uchar *)0x0) {
      return (uchar *)0x0;
    }
    uVar59 = s->img_x;
  }
  *x = uVar59;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = s->img_n;
    return puVar34;
  }
  return puVar34;
LAB_0011f6be:
  bVar64 = false;
LAB_0011f6c0:
  if (!bVar64) goto LAB_00120828;
LAB_0011f6ce:
  if ((byte)j.code_buffer == 0xff) {
    do {
      iVar16 = stbi__at_eof((stbi__context *)local_4a18);
      if (iVar16 != 0) goto LAB_0011eba3;
      sVar10 = stbi__get8((stbi__context *)local_4a18);
    } while (sVar10 == '\0');
    if (sVar10 != 0xff) {
      stbi__g_failure_reason = "junk before marker";
      goto LAB_00120828;
    }
    j.code_buffer._0_1_ = stbi__get8((stbi__context *)local_4a18);
  }
LAB_0011eba3:
  bVar8 = stbi__get_marker((stbi__jpeg *)local_4a18);
  goto LAB_0011eb7c;
LAB_0011fdda:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_00120828;
LAB_001218ed:
  do {
    stbi__skip(s,n);
    bVar8 = stbi__get8(s);
    n = (uint)bVar8;
  } while (bVar8 != 0);
LAB_00121908:
  if (j.s != (stbi__context *)0x0) {
    psVar37 = j.s;
    if ((req_comp & 0xfffffffbU) != 0) {
      psVar37 = (stbi__context *)
                stbi__convert_format((uchar *)j.s,4,req_comp,local_4a18._0_4_,local_4a18._4_4_);
    }
    goto LAB_00120c79;
  }
  goto LAB_00120c77;
LAB_0012088c:
  stbi__g_failure_reason = "bad format";
  goto LAB_00120902;
LAB_001208f4:
  stbi__g_failure_reason = "bad file";
LAB_00120902:
  free(puVar34);
  puVar34 = (uchar *)0x0;
LAB_0012091c:
  *x = uVar59;
  *y = uVar55;
  if (req_comp == 0) {
    req_comp = *comp;
  }
  puVar34 = stbi__convert_format(puVar34,4,req_comp,uVar59,uVar55);
  return puVar34;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}